

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O2

void __thiscall ymfm::opll_base::generate(opll_base *this,output_data *output,uint32_t numsamples)

{
  output_data *output_00;
  int iVar1;
  long lVar2;
  
  for (lVar2 = 0; numsamples != (uint32_t)lVar2; lVar2 = lVar2 + 1) {
    output_00 = output + lVar2;
    fm_engine_base<ymfm::opll_registers>::clock(&this->m_fm);
    *(undefined8 *)output_00->data = 0;
    fm_engine_base<ymfm::opll_registers>::output(&this->m_fm,output_00,5,0x100,0x1ff);
    iVar1 = output_00->data[1];
    output_00->data[0] = (output_00->data[0] << 7) / 9;
    output_00->data[1] = (iVar1 << 7) / 9;
  }
  return;
}

Assistant:

void opll_base::generate(output_data *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		// clock the system
		m_fm.clock(fm_engine::ALL_CHANNELS);

		// update the FM content; OPLL has a built-in 9-bit DAC
		m_fm.output(output->clear(), 5, 256, fm_engine::ALL_CHANNELS);

		// final output is multiplexed; we don't simulate that here except
		// to average over everything
		output->data[0] = (output->data[0] * 128) / 9;
		output->data[1] = (output->data[1] * 128) / 9;
	}
}